

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionOperators.cpp
# Opt level: O2

void Js::JavascriptExceptionOperators::AppendExternalFrameToStackTrace
               (CompoundString *bs,LPCWSTR functionName,LPCWSTR fileName,ULONG lineNumber,
               LONG characterPosition)

{
  code *pcVar1;
  bool bVar2;
  errno_t eVar3;
  CharCount CVar4;
  CharCount CVar5;
  charcount_t cVar6;
  undefined4 *puVar7;
  char16 *pcVar8;
  size_t sVar9;
  CharCount CVar10;
  char16_t *pcVar11;
  char16 *extraout_RDX;
  char16 *extraout_RDX_00;
  char16 *extraout_RDX_01;
  char16 *extraout_RDX_02;
  char16 *pcVar12;
  uint uVar13;
  WCHAR local_438 [4];
  char16 ext [256];
  char16 shortfilename [256];
  
  CVar10 = lineNumber;
  if (DAT_01459495 == '\x01') {
    CompoundString::AppendChars<6u>(bs,(char16 (*) [6])L"\n\tat ",true);
  }
  else {
    CompoundString::AppendChars<8u>(bs,(char16 (*) [8])L"\n   at ",true);
  }
  CompoundString::AppendCharsSz(bs,functionName);
  CompoundString::AppendChars<3u>(bs,(char16 (*) [3])0xf1cfa4,true);
  if ((DAT_01459495 == '\x01') && (*fileName != L'\0')) {
    CVar10 = 0;
    eVar3 = _wsplitpath_s(fileName,(WCHAR *)0x0,0,(WCHAR *)0x0,0,ext + 0xfc,0x100,local_438,0x100);
    if (eVar3 == 0) {
      CompoundString::AppendCharsSz(bs,ext + 0xfc);
      fileName = local_438;
    }
  }
  CompoundString::AppendCharsSz(bs,fileName);
  CompoundString::AppendChars(bs,L':');
  bVar2 = JavascriptString::IsFinalized((JavascriptString *)bs);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    CVar10 = 0xf56392;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                       ,0x4ed,"(!toString->IsFinalized())","!toString->IsFinalized()");
    if (!bVar2) goto LAB_0098e2ef;
    *puVar7 = 0;
  }
  bVar2 = CompoundString::OwnsLastBlock(bs);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    CVar10 = 0xf563c7;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                       ,0x4ee,"(toString->OwnsLastBlock())","toString->OwnsLastBlock()");
    if (!bVar2) goto LAB_0098e2ef;
    *puVar7 = 0;
  }
  bVar2 = CompoundString::HasOnlyDirectChars(bs);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    CVar10 = 0xf56415;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                       ,0x4ef,"(!(appendChars && !toString->HasOnlyDirectChars()))",
                       "!(appendChars && !toString->HasOnlyDirectChars())");
    if (!bVar2) goto LAB_0098e2ef;
    *puVar7 = 0;
  }
  CVar4 = CompoundString::LastBlockCharLength(bs);
  CVar5 = CompoundString::LastBlockCharCapacity(bs);
  if (CVar5 - CVar4 < 0xb) {
    pcVar8 = ext + 0xfc;
    pcVar12 = extraout_RDX;
  }
  else {
    pcVar8 = CompoundString::LastBlockChars(bs);
    pcVar8 = pcVar8 + CVar4;
    pcVar12 = extraout_RDX_00;
    CVar10 = CVar4;
  }
  AppendExternalFrameToStackTrace::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)(ulong)lineNumber,(ULONG)pcVar8,pcVar12,CVar10);
  sVar9 = PAL_wcslen(pcVar8);
  bVar2 = Phases::IsEnabled((Phases *)&DAT_01453738,StringConcatPhase);
  uVar13 = (uint)sVar9;
  if (bVar2) {
    pcVar11 = L"";
    if (8 < uVar13) {
      pcVar11 = L"...";
    }
    Output::Print(L"CompoundString::AppendGeneric(TValue &, appendChars = %s) - converted = \"%.8s%s\", appendCharLength = %u\n"
                  ,L"true",pcVar8,pcVar11,sVar9 & 0xffffffff);
    CVar10 = (CharCount)pcVar11;
    Output::Flush();
  }
  if (CVar5 - CVar4 < 0xb) {
    if (pcVar8 != ext + 0xfc) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                         ,0x50c,"(convertBuffer == localConvertBuffer)",
                         "convertBuffer == localConvertBuffer");
      if (!bVar2) goto LAB_0098e2ef;
      *puVar7 = 0;
    }
    CVar10 = 1;
    CompoundString::AppendGeneric<Js::CompoundString>(ext + 0xfc,uVar13,bs,true);
  }
  else {
    cVar6 = JavascriptString::GetLength((JavascriptString *)bs);
    JavascriptString::SetLength((JavascriptString *)bs,cVar6 + uVar13);
    CompoundString::SetLastBlockCharLength(bs,CVar4 + uVar13);
  }
  CompoundString::AppendChars(bs,L':');
  bVar2 = JavascriptString::IsFinalized((JavascriptString *)bs);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    CVar10 = 0xf56392;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                       ,0x4ed,"(!toString->IsFinalized())","!toString->IsFinalized()");
    if (!bVar2) goto LAB_0098e2ef;
    *puVar7 = 0;
  }
  bVar2 = CompoundString::OwnsLastBlock(bs);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    CVar10 = 0xf563c7;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                       ,0x4ee,"(toString->OwnsLastBlock())","toString->OwnsLastBlock()");
    if (!bVar2) goto LAB_0098e2ef;
    *puVar7 = 0;
  }
  bVar2 = CompoundString::HasOnlyDirectChars(bs);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    CVar10 = 0xf56415;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                       ,0x4ef,"(!(appendChars && !toString->HasOnlyDirectChars()))",
                       "!(appendChars && !toString->HasOnlyDirectChars())");
    if (!bVar2) goto LAB_0098e2ef;
    *puVar7 = 0;
  }
  CVar4 = CompoundString::LastBlockCharLength(bs);
  CVar5 = CompoundString::LastBlockCharCapacity(bs);
  if (CVar5 - CVar4 < 0xb) {
    pcVar8 = ext + 0xfc;
    pcVar12 = extraout_RDX_01;
  }
  else {
    pcVar8 = CompoundString::LastBlockChars(bs);
    pcVar8 = pcVar8 + CVar4;
    pcVar12 = extraout_RDX_02;
    CVar10 = CVar4;
  }
  AppendExternalFrameToStackTrace::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)(ulong)(uint)characterPosition,(ULONG)pcVar8,pcVar12,CVar10)
  ;
  sVar9 = PAL_wcslen(pcVar8);
  bVar2 = Phases::IsEnabled((Phases *)&DAT_01453738,StringConcatPhase);
  uVar13 = (uint)sVar9;
  if (bVar2) {
    pcVar11 = L"";
    if (8 < uVar13) {
      pcVar11 = L"...";
    }
    Output::Print(L"CompoundString::AppendGeneric(TValue &, appendChars = %s) - converted = \"%.8s%s\", appendCharLength = %u\n"
                  ,L"true",pcVar8,pcVar11,sVar9 & 0xffffffff);
    Output::Flush();
  }
  if (CVar5 - CVar4 < 0xb) {
    if (pcVar8 != ext + 0xfc) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                         ,0x50c,"(convertBuffer == localConvertBuffer)",
                         "convertBuffer == localConvertBuffer");
      if (!bVar2) {
LAB_0098e2ef:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar7 = 0;
    }
    CompoundString::AppendGeneric<Js::CompoundString>(ext + 0xfc,uVar13,bs,true);
  }
  else {
    cVar6 = JavascriptString::GetLength((JavascriptString *)bs);
    JavascriptString::SetLength((JavascriptString *)bs,cVar6 + uVar13);
    CompoundString::SetLastBlockCharLength(bs,CVar4 + uVar13);
  }
  CompoundString::AppendChars(bs,L')');
  return;
}

Assistant:

void JavascriptExceptionOperators::AppendExternalFrameToStackTrace(CompoundString* bs, LPCWSTR functionName, LPCWSTR fileName, ULONG lineNumber, LONG characterPosition)
    {
        // format is equivalent to wprintf("\n   at %s (%s:%d:%d)", functionName, filename, lineNumber, characterPosition);

        const CharCount maxULongStringLength = 10; // excluding null terminator
        const auto ConvertULongToString = [](const ULONG value, char16 *const buffer, const CharCount charCapacity)
        {
            const errno_t err = _ultow_s(value, buffer, charCapacity, 10);
            Assert(err == 0);
        };
        if (CONFIG_FLAG(ExtendedErrorStackForTestHost))
        {
            bs->AppendChars(_u("\n\tat "));
        }
        else
        {
            bs->AppendChars(_u("\n   at "));
        }
        bs->AppendCharsSz(functionName);
        bs->AppendChars(_u(" ("));

        if (CONFIG_FLAG(ExtendedErrorStackForTestHost) && *fileName != _u('\0'))
        {
            char16 shortfilename[_MAX_FNAME];
            char16 ext[_MAX_EXT];
            errno_t err = _wsplitpath_s(fileName, NULL, 0, NULL, 0, shortfilename, _MAX_FNAME, ext, _MAX_EXT);
            if (err != 0)
            {
                bs->AppendCharsSz(fileName);
            }
            else
            {
                bs->AppendCharsSz(shortfilename);
                bs->AppendCharsSz(ext);
            }
        }
        else
        {
            bs->AppendCharsSz(fileName);
        }
        bs->AppendChars(_u(':'));
        bs->AppendChars(lineNumber, maxULongStringLength, ConvertULongToString);
        bs->AppendChars(_u(':'));
        bs->AppendChars(characterPosition, maxULongStringLength, ConvertULongToString);
        bs->AppendChars(_u(')'));
    }